

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOMaterial.cpp
# Opt level: O0

aiTextureMapMode GetMapMode(Wrap in)

{
  Logger *this;
  aiTextureMapMode local_c;
  Wrap in_local;
  
  switch(in) {
  case RESET:
    this = Assimp::DefaultLogger::get();
    Assimp::Logger::warn(this,"LWO2: Unsupported texture map mode: RESET");
  case EDGE:
    local_c = aiTextureMapMode_Clamp;
    break;
  case REPEAT:
    local_c = aiTextureMapMode_Wrap;
    break;
  case MIRROR:
    local_c = aiTextureMapMode_Mirror;
    break;
  default:
    local_c = aiTextureMapMode_Wrap;
  }
  return local_c;
}

Assistant:

inline aiTextureMapMode GetMapMode(LWO::Texture::Wrap in)
{
    switch (in)
    {
        case LWO::Texture::REPEAT:
            return aiTextureMapMode_Wrap;

        case LWO::Texture::MIRROR:
            return aiTextureMapMode_Mirror;

        case LWO::Texture::RESET:
            ASSIMP_LOG_WARN("LWO2: Unsupported texture map mode: RESET");

            // fall though here
        case LWO::Texture::EDGE:
            return aiTextureMapMode_Clamp;
    }
    return (aiTextureMapMode)0;
}